

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O3

pair<std::vector<char16_t,_std::allocator<char16_t>_>,_std::vector<char16_t,_std::allocator<char16_t>_>_>
* __thiscall
jessilib::
split_once<std::vector<char16_t,std::allocator<char16_t>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,char16_t>
          (pair<std::vector<char16_t,_std::allocator<char16_t>_>,_std::vector<char16_t,_std::allocator<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                end,char16_t in_delim)

{
  pointer pcVar1;
  __normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> __last;
  allocator_type local_79;
  pointer local_78;
  pointer pcStack_70;
  pointer local_68;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  void *pvStack_40;
  undefined8 local_38;
  long lStack_30;
  pointer local_28;
  pointer pcStack_20;
  
  local_38 = 0;
  lStack_30 = 0;
  local_48 = (pointer)0x0;
  pvStack_40 = (void *)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  __last._M_current = (char16_t *)this;
  if (this < begin._M_current) {
    do {
      if (*__last._M_current == (char16_t)end._M_current) {
        std::vector<char16_t,std::allocator<char16_t>>::
        vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                  ((vector<char16_t,std::allocator<char16_t>> *)&local_78,
                   (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                    )this,__last,&local_79);
        local_58 = local_78;
        pcStack_50 = pcStack_70;
        local_48 = local_68;
        std::vector<char16_t,std::allocator<char16_t>>::
        vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                  ((vector<char16_t,std::allocator<char16_t>> *)&local_78,
                   (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                    )(__last._M_current + 1),begin,&local_79);
        pcVar1 = local_68;
        local_28 = local_78;
        pcStack_20 = pcStack_70;
        local_78 = (pointer)0x0;
        pcStack_70 = (pointer)0x0;
        local_68 = (pointer)0x0;
        if ((pvStack_40 != (void *)0x0) &&
           (operator_delete(pvStack_40,lStack_30 - (long)pvStack_40), local_78 != (pointer)0x0)) {
          operator_delete(local_78,(long)local_68 - (long)local_78);
        }
        (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_start = local_58;
        (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcStack_50;
        (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
        (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_start = local_28;
        (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcStack_20;
        (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = pcVar1;
        return __return_storage_ptr__;
      }
      __last._M_current = __last._M_current + 1;
    } while (__last._M_current != begin._M_current);
    std::vector<char16_t,std::allocator<char16_t>>::
    vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
              ((vector<char16_t,std::allocator<char16_t>> *)&local_78,
               (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                )this,begin,&local_79);
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_start = local_78;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pcStack_70;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_68;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}